

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-generated-function-mockers.h
# Opt level: O0

MockSpec<unsigned_char_(unsigned_short)> * __thiscall
testing::internal::FunctionMocker<unsigned_char_(unsigned_short)>::With
          (MockSpec<unsigned_char_(unsigned_short)> *__return_storage_ptr__,
          FunctionMocker<unsigned_char_(unsigned_short)> *this,Matcher<unsigned_short> *m1)

{
  tuple<testing::Matcher<unsigned_short>_> local_38;
  Matcher<unsigned_short> *local_20;
  Matcher<unsigned_short> *m1_local;
  FunctionMocker<unsigned_char_(unsigned_short)> *this_local;
  
  local_20 = m1;
  m1_local = (Matcher<unsigned_short> *)this;
  this_local = (FunctionMocker<unsigned_char_(unsigned_short)> *)__return_storage_ptr__;
  std::make_tuple<testing::Matcher<unsigned_short>const&>(&local_38,m1);
  MockSpec<unsigned_char_(unsigned_short)>::MockSpec
            (__return_storage_ptr__,&this->super_FunctionMockerBase<unsigned_char_(unsigned_short)>,
             &local_38);
  std::tuple<testing::Matcher<unsigned_short>_>::~tuple(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(const Matcher<A1>& m1) {
    return MockSpec<F>(this, ::testing::make_tuple(m1));
  }